

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScene::wheelEvent(QGraphicsScene *this,QGraphicsSceneWheelEvent *wheelEvent)

{
  QGraphicsScenePrivate *this_00;
  QGraphicsItem *pQVar1;
  QGraphicsItemPrivate *this_01;
  QGraphicsItem **ppQVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  GraphicsItemFlags GVar6;
  FocusPolicy FVar7;
  QGraphicsScenePrivate *d;
  QWidget *pQVar8;
  QGraphicsWidget **ppQVar9;
  QGraphicsWidget *pQVar10;
  undefined1 *puVar11;
  long lVar12;
  QGraphicsWidget **ppQVar13;
  long in_FS_OFFSET;
  QPointF QVar14;
  QPointF local_78;
  QPointF local_68;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_78.xp = (qreal)QGraphicsSceneWheelEvent::screenPos(wheelEvent);
  QVar14 = QGraphicsSceneWheelEvent::scenePos(wheelEvent);
  local_68.yp = QVar14.yp;
  local_68.xp = QVar14.xp;
  pQVar8 = QGraphicsSceneEvent::widget(&wheelEvent->super_QGraphicsSceneEvent);
  QGraphicsScenePrivate::itemsAtPosition
            ((QList<QGraphicsItem_*> *)&local_58,this_00,(QPoint *)&local_78,&local_68,pQVar8);
  ppQVar9 = (this_00->popupWidgets).d.ptr;
  ppQVar13 = ppQVar9 + (this_00->popupWidgets).d.size;
  while (puVar11 = (undefined1 *)local_58.size, ppQVar9 < ppQVar13) {
    if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
      puVar11 = (undefined1 *)0x0;
      break;
    }
    pQVar10 = ppQVar13[-1];
    pQVar1 = &(pQVar10->super_QGraphicsObject).super_QGraphicsItem;
    if (pQVar10 != (QGraphicsWidget *)0x0) {
      pQVar10 = (QGraphicsWidget *)pQVar1;
    }
    if (((QGraphicsWidget *)*local_58.ptr == pQVar10) ||
       (bVar3 = QGraphicsItem::isAncestorOf(pQVar1,*local_58.ptr),
       puVar11 = (undefined1 *)local_58.size, bVar3)) break;
    ppQVar13 = ppQVar13 + -1;
    QGraphicsScenePrivate::removePopup(this_00,*ppQVar13,false);
    ppQVar9 = (this_00->popupWidgets).d.ptr;
  }
  ppQVar2 = local_58.ptr;
  bVar3 = false;
  for (lVar12 = 0; (long)puVar11 * 8 != lVar12; lVar12 = lVar12 + 8) {
    pQVar1 = *(QGraphicsItem **)((long)ppQVar2 + lVar12);
    if (bVar3) {
LAB_0059bcd8:
      bVar3 = true;
    }
    else {
      bVar3 = QGraphicsItem::isEnabled(pQVar1);
      if ((((bVar3) &&
           (GVar6 = QGraphicsItem::flags(pQVar1),
           ((uint)GVar6.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                  super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 4) != 0)) &&
          ((((pQVar1->d_ptr).d)->field_0x168 & 2) != 0)) &&
         ((bVar3 = QGraphicsItem::isWidget(pQVar1), bVar3 &&
          (FVar7 = QGraphicsWidget::focusPolicy((QGraphicsWidget *)(pQVar1 + -1)),
          FVar7 == WheelFocus)))) {
        if (pQVar1 != *(QGraphicsItem **)
                       (*(long *)(this + 8) + 0x188 +
                       (ulong)(*(int *)(*(long *)(this + 8) + 0x1b8) < 1) * 0x10)) {
          QGraphicsItem::setFocus(pQVar1,MouseFocusReason);
        }
        goto LAB_0059bcd8;
      }
      bVar3 = false;
    }
    this_01 = (pQVar1->d_ptr).d;
    QVar14 = QGraphicsSceneWheelEvent::scenePos(wheelEvent);
    local_78.yp = QVar14.yp;
    local_78.xp = QVar14.xp;
    pQVar8 = QGraphicsSceneEvent::widget(&wheelEvent->super_QGraphicsSceneEvent);
    QVar14 = QGraphicsItemPrivate::genericMapFromScene(this_01,&local_78,pQVar8);
    local_68.yp = QVar14.yp;
    local_68.xp = QVar14.xp;
    QGraphicsSceneWheelEvent::setPos(wheelEvent,&local_68);
    (wheelEvent->super_QGraphicsSceneEvent).field_0xc = 1;
    bVar4 = QGraphicsItem::isPanel(pQVar1);
    bVar5 = QGraphicsScenePrivate::sendEvent(this_00,pQVar1,(QEvent *)wheelEvent);
    if ((bVar5) && ((bVar4 || ((wheelEvent->super_QGraphicsSceneEvent).field_0xc != '\0')))) break;
  }
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::wheelEvent(QGraphicsSceneWheelEvent *wheelEvent)
{
    Q_D(QGraphicsScene);
    const QList<QGraphicsItem *> wheelCandidates = d->itemsAtPosition(wheelEvent->screenPos(),
                                                                      wheelEvent->scenePos(),
                                                                      wheelEvent->widget());

    // Find the first popup under the mouse (including the popup's descendants) starting from the last.
    // Remove all popups after the one found, or all or them if no popup is under the mouse.
    // Then continue with the event.
    QList<QGraphicsWidget *>::const_iterator iter = d->popupWidgets.constEnd();
    while (iter > d->popupWidgets.constBegin() && !wheelCandidates.isEmpty()) {
        --iter;
        if (wheelCandidates.first() == *iter || (*iter)->isAncestorOf(wheelCandidates.first()))
            break;
        d->removePopup(*iter);
    }

    bool hasSetFocus = false;
    for (QGraphicsItem *item : wheelCandidates) {
        if (!hasSetFocus && item->isEnabled()
            && ((item->flags() & QGraphicsItem::ItemIsFocusable) && item->d_ptr->mouseSetsFocus)) {
            if (item->isWidget() && static_cast<QGraphicsWidget *>(item)->focusPolicy() == Qt::WheelFocus) {
                hasSetFocus = true;
                if (item != focusItem())
                    setFocusItem(item, Qt::MouseFocusReason);
            }
        }

        wheelEvent->setPos(item->d_ptr->genericMapFromScene(wheelEvent->scenePos(),
                                                            wheelEvent->widget()));
        wheelEvent->accept();
        bool isPanel = item->isPanel();
        bool ret = d->sendEvent(item, wheelEvent);

        if (ret && (isPanel || wheelEvent->isAccepted()))
            break;
    }
}